

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerType.cpp
# Opt level: O2

void __thiscall hdc::PointerType::~PointerType(PointerType *this)

{
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019a9d8;
  if (this->subtype != (Type *)0x0) {
    (*(this->subtype->super_ASTNode)._vptr_ASTNode[2])();
  }
  std::__cxx11::string::~string((string *)&(this->token).lexem);
  Type::~Type(&this->super_Type);
  return;
}

Assistant:

PointerType::~PointerType() {
    if (subtype != nullptr) {
        delete subtype;
    }
}